

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void ast::Sections::binary_logisim
               (char *file_name,uint word_size,uint byte_order,uint lower_address,
               uint higher_address)

{
  byte bVar1;
  byte bVar2;
  ostream *poVar3;
  uint uVar4;
  uint address;
  ofstream file;
  
  std::ofstream::ofstream(&file,file_name,_S_out);
  poVar3 = std::operator<<((ostream *)&file,"v2.0 raw");
  std::endl<char,std::char_traits<char>>(poVar3);
  address = lower_address + byte_order;
  do {
    while( true ) {
      if (higher_address <= address) {
        std::ofstream::close();
        std::ofstream::~ofstream(&file);
        return;
      }
      bVar1 = Memory_space::read8((Memory_space *)memory,address);
      bVar2 = Memory_space::read8((Memory_space *)memory,address + word_size);
      if (bVar2 == bVar1) break;
      ostream_printf((ostream *)&file," %02x",(ulong)(uint)bVar1);
      address = address + word_size;
    }
    uVar4 = 2;
    for (address = address + word_size * 2; address < higher_address; address = address + word_size)
    {
      bVar2 = Memory_space::read8((Memory_space *)memory,address);
      if (bVar1 != bVar2) break;
      uVar4 = uVar4 + 1;
    }
    ostream_printf((ostream *)&file," %d*%02x",(ulong)uVar4,(ulong)(uint)bVar1);
  } while( true );
}

Assistant:

void Sections::binary_logisim(const char *file_name,
								unsigned word_size, unsigned byte_order,
								unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		file << "v2.0 raw" << endl;
		for (auto address = lower_address + byte_order; address < higher_address; ) {
			uint8_t c = memory.read8(address);
			address += word_size;
			//	Quantos bytes iguais a este?
			if (memory.read8(address) == c) {
				auto j = 2U;
				for (address += word_size;
				     	address < higher_address && c == memory.read8(address);
					 		address += word_size, j++)
					;
				ostream_printf(file, " %d*%02x", j, static_cast<uint8_t >(c));
			}
			else
				ostream_printf(file, " %02x", static_cast<uint8_t >(c));
		}
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}